

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cswCut.c
# Opt level: O3

int Csw_CutMergeOrdered(Csw_Man_t *p,Csw_Cut_t *pC0,Csw_Cut_t *pC1,Csw_Cut_t *pC)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  
  bVar1 = pC0->nFanins;
  uVar7 = (ulong)bVar1;
  cVar2 = pC1->nFanins;
  uVar8 = (uint)cVar2;
  if ((char)bVar1 < cVar2) {
    __assert_fail("pC0->nFanins >= pC1->nFanins",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/csw/cswCut.c"
                  ,0x129,
                  "int Csw_CutMergeOrdered(Csw_Man_t *, Csw_Cut_t *, Csw_Cut_t *, Csw_Cut_t *)");
  }
  uVar11 = (uint)(char)bVar1;
  uVar6 = p->nLeafMax;
  if (uVar6 == uVar8 && uVar6 == uVar11) {
    if ('\0' < (char)bVar1) {
      uVar9 = 0;
      do {
        if (*(int *)((long)&pC0[1].pNext + uVar9 * 4) != *(int *)((long)&pC1[1].pNext + uVar9 * 4))
        {
          return 0;
        }
        uVar9 = uVar9 + 1;
      } while (uVar11 != uVar9);
      if ('\0' < (char)bVar1) {
        uVar9 = 0;
        do {
          *(undefined4 *)((long)&pC[1].pNext + uVar9 * 4) =
               *(undefined4 *)((long)&pC0[1].pNext + uVar9 * 4);
          uVar9 = uVar9 + 1;
        } while (uVar11 != uVar9);
      }
    }
  }
  else if (uVar6 == uVar11) {
    uVar9 = (ulong)uVar11;
    if ('\0' < cVar2) {
      uVar10 = 0;
      uVar5 = uVar9;
LAB_004f6090:
      do {
        if ((int)uVar5 < 1) {
          if (uVar5 == 0) {
            return 0;
          }
        }
        else {
          lVar13 = uVar5 * 2;
          uVar5 = uVar5 - 1;
          if (*(int *)(&pC0->nCutSize + lVar13) != *(int *)((long)&pC1[1].pNext + uVar10 * 4))
          goto LAB_004f6090;
        }
        uVar10 = uVar10 + 1;
        uVar5 = uVar9;
      } while (uVar10 != uVar8);
    }
    if ('\0' < (char)bVar1) {
      uVar5 = 0;
      do {
        *(undefined4 *)((long)&pC[1].pNext + uVar5 * 4) =
             *(undefined4 *)((long)&pC0[1].pNext + uVar5 * 4);
        uVar5 = uVar5 + 1;
      } while (uVar9 != uVar5);
    }
  }
  else {
    if ((int)uVar6 < 1) {
      uVar12 = 0;
      uVar6 = 0;
      uVar7 = 0;
    }
    else {
      uVar7 = 0;
      uVar6 = 0;
      uVar12 = 0;
      do {
        if (uVar6 == uVar8) {
          if (uVar12 == uVar11) goto LAB_004f616e;
          *(undefined4 *)((long)&pC[1].pNext + uVar7 * 4) =
               *(undefined4 *)((long)&pC0[1].pNext + (long)(int)uVar12 * 4);
          uVar6 = uVar8;
          uVar12 = uVar12 + 1;
        }
        else {
          lVar13 = (long)(int)uVar6;
          if (uVar12 == uVar11) {
            uVar6 = uVar6 + 1;
            *(undefined4 *)((long)&pC[1].pNext + uVar7 * 4) =
                 *(undefined4 *)((long)&pC1[1].pNext + lVar13 * 4);
            uVar12 = uVar11;
          }
          else {
            iVar3 = *(int *)((long)&pC0[1].pNext + (long)(int)uVar12 * 4);
            iVar4 = *(int *)((long)&pC1[1].pNext + lVar13 * 4);
            if (iVar3 < iVar4) {
              uVar12 = uVar12 + 1;
              *(int *)((long)&pC[1].pNext + uVar7 * 4) = iVar3;
            }
            else if (iVar4 < iVar3) {
              uVar6 = uVar6 + 1;
              *(int *)((long)&pC[1].pNext + uVar7 * 4) = iVar4;
            }
            else {
              uVar12 = uVar12 + 1;
              *(int *)((long)&pC[1].pNext + uVar7 * 4) = iVar3;
              uVar6 = uVar6 + 1;
            }
          }
        }
        uVar7 = uVar7 + 1;
      } while ((long)uVar7 < (long)p->nLeafMax);
    }
    if ((int)uVar12 < (int)uVar11) {
      return 0;
    }
    if ((int)uVar6 < (int)uVar8) {
      return 0;
    }
  }
LAB_004f616e:
  pC->nFanins = (char)uVar7;
  return 1;
}

Assistant:

static inline int Csw_CutMergeOrdered( Csw_Man_t * p, Csw_Cut_t * pC0, Csw_Cut_t * pC1, Csw_Cut_t * pC )
{ 
    int i, k, c;
    assert( pC0->nFanins >= pC1->nFanins );
    // the case of the largest cut sizes
    if ( pC0->nFanins == p->nLeafMax && pC1->nFanins == p->nLeafMax )
    {
        for ( i = 0; i < pC0->nFanins; i++ )
            if ( pC0->pFanins[i] != pC1->pFanins[i] )
                return 0;
        for ( i = 0; i < pC0->nFanins; i++ )
            pC->pFanins[i] = pC0->pFanins[i];
        pC->nFanins = pC0->nFanins;
        return 1;
    }
    // the case when one of the cuts is the largest
    if ( pC0->nFanins == p->nLeafMax )
    {
        for ( i = 0; i < pC1->nFanins; i++ )
        {
            for ( k = pC0->nFanins - 1; k >= 0; k-- )
                if ( pC0->pFanins[k] == pC1->pFanins[i] )
                    break;
            if ( k == -1 ) // did not find
                return 0;
        }
        for ( i = 0; i < pC0->nFanins; i++ )
            pC->pFanins[i] = pC0->pFanins[i];
        pC->nFanins = pC0->nFanins;
        return 1;
    }

    // compare two cuts with different numbers
    i = k = 0;
    for ( c = 0; c < p->nLeafMax; c++ )
    {
        if ( k == pC1->nFanins )
        {
            if ( i == pC0->nFanins )
            {
                pC->nFanins = c;
                return 1;
            }
            pC->pFanins[c] = pC0->pFanins[i++];
            continue;
        }
        if ( i == pC0->nFanins )
        {
            if ( k == pC1->nFanins )
            {
                pC->nFanins = c;
                return 1;
            }
            pC->pFanins[c] = pC1->pFanins[k++];
            continue;
        }
        if ( pC0->pFanins[i] < pC1->pFanins[k] )
        {
            pC->pFanins[c] = pC0->pFanins[i++];
            continue;
        }
        if ( pC0->pFanins[i] > pC1->pFanins[k] )
        {
            pC->pFanins[c] = pC1->pFanins[k++];
            continue;
        }
        pC->pFanins[c] = pC0->pFanins[i++]; 
        k++;
    }
    if ( i < pC0->nFanins || k < pC1->nFanins )
        return 0;
    pC->nFanins = c;
    return 1;
}